

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O3

void __thiscall
chrono::ChSystemDescriptor::ConvertToMatrixForm
          (ChSystemDescriptor *this,ChSparseMatrix *Cq,ChSparseMatrix *H,ChSparseMatrix *E,
          ChVectorDynamic<> *Fvector,ChVectorDynamic<> *Bvector,ChVectorDynamic<> *Frict,
          bool only_bilaterals,bool skip_contacts_uv)

{
  double *pdVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  pointer ppCVar4;
  pointer ppCVar5;
  pointer ppCVar6;
  ChConstraint *pCVar7;
  ChVariables *pCVar8;
  double *pdVar9;
  ChKblock *pCVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  int iVar18;
  uint uVar19;
  Index size;
  long lVar20;
  long lVar21;
  pointer ppCVar22;
  double *pdVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  uint uVar29;
  ulong uVar30;
  long lVar31;
  ChVectorRef local_48;
  
  ppCVar22 = (this->vvariables).
             super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  ppCVar2 = (this->vstiffness).
            super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppCVar3 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar4 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  uVar30 = 0;
  ppCVar5 = (this->vvariables).
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar6 = (this->vstiffness).
            super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar20 = (long)ppCVar4 - (long)ppCVar3 >> 3;
  if (ppCVar4 != ppCVar3) {
    lVar31 = 0;
    do {
      pCVar7 = ppCVar3[lVar31];
      if ((pCVar7->active == true) && (!only_bilaterals || pCVar7->mode != CONSTRAINT_FRIC)) {
        lVar21 = __dynamic_cast(pCVar7,&ChConstraint::typeinfo,
                                &ChConstraintTwoTuplesFrictionTall::typeinfo,0xfffffffffffffffe);
        uVar30 = (ulong)((int)uVar30 + (uint)(lVar21 == 0 || !skip_contacts_uv));
      }
      lVar31 = lVar31 + 1;
    } while (lVar20 + (ulong)(lVar20 == 0) != lVar31);
    uVar30 = (ulong)(int)uVar30;
  }
  iVar18 = (*this->_vptr_ChSystemDescriptor[7])(this);
  this->n_q = iVar18;
  if (Cq != (ChSparseMatrix *)0x0) {
    Eigen::SparseMatrix<double,_1,_int>::resize(Cq,uVar30,(long)iVar18);
  }
  if (H != (ChSparseMatrix *)0x0) {
    Eigen::SparseMatrix<double,_1,_int>::resize(H,(long)this->n_q,(long)this->n_q);
  }
  if (E != (ChSparseMatrix *)0x0) {
    Eigen::SparseMatrix<double,_1,_int>::resize(E,uVar30,uVar30);
  }
  if (Fvector != (ChVectorDynamic<> *)0x0) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&Fvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (long)this->n_q);
    lVar31 = (Fvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
    if (lVar31 < 0) goto LAB_00792861;
    if (lVar31 != 0) {
      memset((Fvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data,0,lVar31 << 3);
    }
  }
  if (Bvector != (ChVectorDynamic<> *)0x0) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&Bvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar30);
    lVar31 = (Bvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
    if (lVar31 < 0) goto LAB_00792861;
    if (lVar31 != 0) {
      memset((Bvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data,0,lVar31 << 3);
    }
  }
  if (Frict != (ChVectorDynamic<> *)0x0) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&Frict->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar30);
    lVar31 = (Frict->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
    if (lVar31 < 0) {
LAB_00792861:
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    if (lVar31 != 0) {
      memset((Frict->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data,0,lVar31 << 3);
    }
  }
  if (ppCVar22 != ppCVar5) {
    lVar21 = (long)ppCVar22 - (long)ppCVar5 >> 3;
    lVar31 = 0;
    uVar30 = 0;
    do {
      ppCVar22 = (this->vvariables).
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pCVar8 = ppCVar22[lVar31];
      if (pCVar8->disabled == false) {
        uVar29 = (uint)uVar30;
        if (H != (ChSparseMatrix *)0x0) {
          (*pCVar8->_vptr_ChVariables[9])(this->c_a,pCVar8,H,uVar30,uVar30);
          ppCVar22 = (this->vvariables).
                     super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        }
        if (Fvector != (ChVectorDynamic<> *)0x0) {
          ChVariables::Get_fb(&local_48,ppCVar22[lVar31]);
          uVar19 = (*(this->vvariables).
                     super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar31]->_vptr_ChVariables[2])();
          pdVar9 = (Fvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
          if ((int)uVar19 < 0 && pdVar9 != (double *)0x0) {
            __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                          ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                          "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
                         );
          }
          uVar30 = (ulong)(int)uVar19;
          if (((int)(uVar19 | uVar29) < 0) ||
             ((long)((Fvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_rows - uVar30) < (long)(int)uVar29)) {
            __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                          ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                          "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                         );
          }
          if (local_48.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              ._8_8_ != uVar30) {
            __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                          ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                          "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>]"
                         );
          }
          pdVar9 = pdVar9 + (int)uVar29;
          uVar25 = uVar30;
          if ((((ulong)pdVar9 & 7) == 0) &&
             (uVar25 = (ulong)(-((uint)((ulong)pdVar9 >> 3) & 0x1fffffff) & 7),
             (long)uVar30 <= (long)uVar25)) {
            uVar25 = uVar30;
          }
          uVar27 = uVar30 - uVar25;
          uVar26 = uVar27 + 7;
          if (-1 < (long)uVar27) {
            uVar26 = uVar27;
          }
          if (0 < (long)uVar25) {
            uVar28 = 0;
            do {
              pdVar9[uVar28] =
                   *(double *)
                    (local_48.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._0_8_ + uVar28 * 8);
              uVar28 = uVar28 + 1;
            } while (uVar25 != uVar28);
          }
          uVar26 = (uVar26 & 0xfffffffffffffff8) + uVar25;
          if (7 < (long)uVar27) {
            do {
              pdVar23 = (double *)
                        (local_48.
                         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                         ._0_8_ + uVar25 * 8);
              dVar11 = pdVar23[1];
              dVar12 = pdVar23[2];
              dVar13 = pdVar23[3];
              dVar14 = pdVar23[4];
              dVar15 = pdVar23[5];
              dVar16 = pdVar23[6];
              dVar17 = pdVar23[7];
              pdVar1 = pdVar9 + uVar25;
              *pdVar1 = *pdVar23;
              pdVar1[1] = dVar11;
              pdVar1[2] = dVar12;
              pdVar1[3] = dVar13;
              pdVar1[4] = dVar14;
              pdVar1[5] = dVar15;
              pdVar1[6] = dVar16;
              pdVar1[7] = dVar17;
              uVar25 = uVar25 + 8;
            } while ((long)uVar25 < (long)uVar26);
          }
          if ((long)uVar26 < (long)uVar30) {
            do {
              pdVar9[uVar26] =
                   *(double *)
                    (local_48.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._0_8_ + uVar26 * 8);
              uVar26 = uVar26 + 1;
            } while (uVar30 != uVar26);
          }
          ppCVar22 = (this->vvariables).
                     super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        }
        iVar18 = (*ppCVar22[lVar31]->_vptr_ChVariables[2])();
        uVar30 = (ulong)(uVar29 + iVar18);
      }
      lVar31 = lVar31 + 1;
    } while (lVar31 != lVar21 + (ulong)(lVar21 == 0));
  }
  if (ppCVar2 != ppCVar6 && H != (ChSparseMatrix *)0x0) {
    lVar21 = (long)ppCVar2 - (long)ppCVar6 >> 3;
    lVar31 = 0;
    do {
      pCVar10 = (this->vstiffness).
                super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>._M_impl.
                super__Vector_impl_data._M_start[lVar31];
      (*pCVar10->_vptr_ChKblock[6])(pCVar10,H,1);
      lVar31 = lVar31 + 1;
    } while (lVar21 + (ulong)(lVar21 == 0) != lVar31);
  }
  if (ppCVar4 != ppCVar3) {
    lVar31 = 0;
    uVar30 = 0;
    do {
      pCVar7 = (this->vconstraints).
               super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar31];
      if (((pCVar7->active == true) && (!only_bilaterals || pCVar7->mode != CONSTRAINT_FRIC)) &&
         (lVar21 = __dynamic_cast(pCVar7,&ChConstraint::typeinfo,
                                  &ChConstraintTwoTuplesFrictionTall::typeinfo,0xfffffffffffffffe),
         !skip_contacts_uv || lVar21 == 0)) {
        iVar18 = (int)uVar30;
        if (Cq != (ChSparseMatrix *)0x0) {
          (*pCVar7->_vptr_ChConstraint[0xd])(pCVar7,Cq,uVar30);
        }
        if (E != (ChSparseMatrix *)0x0) {
          (**E->_vptr_SparseMatrix)
                    ((this->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar31]->cfm_i,E,uVar30,uVar30,1);
        }
        lVar21 = (long)iVar18;
        if (Bvector != (ChVectorDynamic<> *)0x0) {
          if ((iVar18 < 0) ||
             ((Bvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows <= lVar21)) goto LAB_00792804;
          (Bvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
          [lVar21] = (this->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar31]->b_i;
        }
        if (Frict != (ChVectorDynamic<> *)0x0) {
          if ((iVar18 < 0) ||
             ((Frict->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows <= lVar21)) {
LAB_00792804:
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          pdVar9 = (Frict->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                   .m_data;
          pdVar9[lVar21] = -2.0;
          pCVar7 = (this->vconstraints).
                   super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar31];
          if (pCVar7 != (ChConstraint *)0x0) {
            pdVar23 = (double *)
                      __dynamic_cast(pCVar7,&ChConstraint::typeinfo,
                                     &ChConstraintTwoTuplesContactNall::typeinfo,0xfffffffffffffffe)
            ;
            if (pdVar23 != (double *)0x0) {
              pdVar9[lVar21] = *pdVar23;
            }
            lVar24 = __dynamic_cast(pCVar7,&ChConstraint::typeinfo,
                                    &ChConstraintTwoTuplesFrictionTall::typeinfo,0xfffffffffffffffe)
            ;
            if (lVar24 != 0) {
              pdVar9[lVar21] = -1.0;
            }
          }
        }
        uVar30 = (ulong)(iVar18 + 1);
      }
      lVar31 = lVar31 + 1;
    } while (lVar20 + (ulong)(lVar20 == 0) != lVar31);
  }
  return;
}

Assistant:

void ChSystemDescriptor::ConvertToMatrixForm(ChSparseMatrix* Cq,
                                             ChSparseMatrix* H,
                                             ChSparseMatrix* E,
                                             ChVectorDynamic<>* Fvector,
                                             ChVectorDynamic<>* Bvector,
                                             ChVectorDynamic<>* Frict,
                                             bool only_bilaterals,
                                             bool skip_contacts_uv) {
    std::vector<ChConstraint*>& mconstraints = GetConstraintsList();
    std::vector<ChVariables*>& mvariables = GetVariablesList();

    auto mv_size = mvariables.size();
    auto mc_size = mconstraints.size();
    auto vs_size = vstiffness.size();

    // Count bilateral and other constraints.. (if wanted, bilaterals only)

    int mn_c = 0;
    for (size_t ic = 0; ic < mc_size; ic++) {
        if (mconstraints[ic]->IsActive())
            if (!((mconstraints[ic]->GetMode() == CONSTRAINT_FRIC) && only_bilaterals))
                if (!((dynamic_cast<ChConstraintTwoTuplesFrictionTall*>(mconstraints[ic])) && skip_contacts_uv)) {
                    mn_c++;
                }
    }

    // Count active variables, by scanning through all variable blocks,
    // and set offsets

    n_q = CountActiveVariables();

    // Reset and resize (if needed) auxiliary vectors

    if (Cq)
        Cq->resize(mn_c, n_q);
    if (H)
        H->resize(n_q, n_q);
    if (E)
        E->resize(mn_c, mn_c);
    if (Fvector)
        Fvector->setZero(n_q);
    if (Bvector)
        Bvector->setZero(mn_c);
    if (Frict)
        Frict->setZero(mn_c);

    // Fills H submasses and 'f' vector,
    // by looping on variables
    int s_q = 0;
    for (size_t iv = 0; iv < mv_size; iv++) {
        if (mvariables[iv]->IsActive()) {
            if (H)
                mvariables[iv]->Build_M(*H, s_q, s_q, c_a);  // .. fills  H  (often H=M , the mass)
            if (Fvector)
                Fvector->segment(s_q, vvariables[iv]->Get_ndof()) = vvariables[iv]->Get_fb();  // .. fills  'f'
            s_q += mvariables[iv]->Get_ndof();
        }
    }

    // If some stiffness / hessian matrix has been added to H ,
    // also add it to the sparse H
    if (H) {
        for (size_t ik = 0; ik < vs_size; ik++) {
            vstiffness[ik]->Build_K(*H, true);
        }
    }

    // Fills Cq jacobian, E 'compliance' matrix , the 'b' vector and friction coeff.vector,
    // by looping on constraints
    int s_c = 0;
    for (size_t ic = 0; ic < mc_size; ic++) {
        if (mconstraints[ic]->IsActive())
            if (!((mconstraints[ic]->GetMode() == CONSTRAINT_FRIC) && only_bilaterals))
                if (!((dynamic_cast<ChConstraintTwoTuplesFrictionTall*>(mconstraints[ic])) && skip_contacts_uv)) {
                    if (Cq)
                        mconstraints[ic]->Build_Cq(*Cq, s_c);  // .. fills Cq
                    if (E)
                        E->SetElement(s_c, s_c, mconstraints[ic]->Get_cfm_i());  // .. fills E ( = cfm )
                    if (Bvector)
                        (*Bvector)(s_c) = mconstraints[ic]->Get_b_i();  // .. fills 'b'
                    if (Frict)                                          // .. fills vector of friction coefficients
                    {
                        (*Frict)(s_c) = -2;  // mark with -2 flag for bilaterals (default)
                        if (auto mcon = dynamic_cast<ChConstraintTwoTuplesContactNall*>(mconstraints[ic]))
                            (*Frict)(s_c) =
                                mcon->GetFrictionCoefficient();  // friction coeff only in row of normal component
                        if (dynamic_cast<ChConstraintTwoTuplesFrictionTall*>(mconstraints[ic]))
                            (*Frict)(s_c) = -1;  // mark with -1 flag for rows of tangential components
                    }
                    s_c++;
                }
    }
}